

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

ZSTD_CCtx * ZSTD_createCCtx_advanced(ZSTD_customMem customMem)

{
  uint *puVar1;
  long lVar2;
  ZSTD_customMem customMem_00;
  ZSTD_CCtx *__s;
  uint uVar3;
  ZSTD_allocFunction in_stack_00000008;
  ZSTD_freeFunction in_stack_00000010;
  void *in_stack_00000018;
  
  if ((in_stack_00000010 == (ZSTD_freeFunction)0x0) ==
      (in_stack_00000008 == (ZSTD_allocFunction)0x0)) {
    customMem_00.customFree = in_stack_00000010;
    customMem_00.customAlloc = in_stack_00000008;
    customMem_00.opaque = in_stack_00000018;
    __s = (ZSTD_CCtx *)ZSTD_malloc(0x3d8,customMem_00);
    if (__s != (ZSTD_CCtx *)0x0) {
      memset(__s,0,0x3d8);
      (__s->customMem).customAlloc = in_stack_00000008;
      (__s->customMem).customFree = in_stack_00000010;
      (__s->customMem).opaque = in_stack_00000018;
      puVar1 = (uint *)cpuid_basic_info(0);
      uVar3 = 0;
      if ((*puVar1 != 0) && (uVar3 = 0, 6 < *puVar1)) {
        lVar2 = cpuid_Extended_Feature_Enumeration_info(7);
        uVar3 = *(uint *)(lVar2 + 4) >> 8 & 1;
      }
      __s->bmi2 = uVar3;
      (__s->requestedParams).fParams.contentSizeFlag = 0;
      (__s->requestedParams).fParams.checksumFlag = 0;
      *(undefined8 *)&(__s->requestedParams).fParams.noDictIDFlag = 0;
      (__s->requestedParams).format = ZSTD_f_zstd1;
      (__s->requestedParams).cParams.windowLog = 0;
      (__s->requestedParams).cParams.chainLog = 0;
      (__s->requestedParams).cParams.hashLog = 0;
      (__s->requestedParams).cParams.searchLog = 0;
      (__s->requestedParams).cParams.minMatch = 0;
      (__s->requestedParams).cParams.targetLength = 0;
      (__s->requestedParams).cParams.strategy = 0;
      (__s->requestedParams).forceWindow = 0;
      (__s->requestedParams).attachDictPref = ZSTD_dictDefaultAttach;
      *(undefined8 *)&(__s->requestedParams).nbWorkers = 0;
      (__s->requestedParams).jobSize = 0;
      (__s->requestedParams).overlapLog = 0;
      (__s->requestedParams).rsyncable = 0;
      (__s->requestedParams).ldmParams.enableLdm = 0;
      (__s->requestedParams).ldmParams.hashLog = 0;
      (__s->requestedParams).ldmParams.bucketSizeLog = 0;
      (__s->requestedParams).ldmParams.minMatchLength = 0;
      (__s->requestedParams).ldmParams.hashRateLog = 0;
      (__s->requestedParams).ldmParams.windowLog = 0;
      (__s->requestedParams).customMem.customAlloc = (ZSTD_allocFunction)0x0;
      (__s->requestedParams).customMem.customFree = (ZSTD_freeFunction)0x0;
      (__s->requestedParams).customMem.opaque = (void *)0x0;
      (__s->requestedParams).compressionLevel = 3;
      (__s->requestedParams).fParams.contentSizeFlag = 1;
      return __s;
    }
  }
  return (ZSTD_CCtx *)0x0;
}

Assistant:

ZSTD_CCtx* ZSTD_createCCtx_advanced(ZSTD_customMem customMem)
{
    ZSTD_STATIC_ASSERT(zcss_init==0);
    ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN==(0ULL - 1));
    if (!customMem.customAlloc ^ !customMem.customFree) return NULL;
    {   ZSTD_CCtx* const cctx = (ZSTD_CCtx*)ZSTD_malloc(sizeof(ZSTD_CCtx), customMem);
        if (!cctx) return NULL;
        ZSTD_initCCtx(cctx, customMem);
        return cctx;
    }
}